

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHingeConstraint.cpp
# Opt level: O2

void __thiscall
btHingeConstraint::btHingeConstraint
          (btHingeConstraint *this,btRigidBody *rbA,btRigidBody *rbB,btTransform *rbAFrame,
          btTransform *rbBFrame,bool useReferenceFrameA)

{
  undefined8 uVar1;
  undefined3 in_register_00000089;
  btScalar bVar2;
  
  btTypedConstraint::btTypedConstraint(&this->super_btTypedConstraint,HINGE_CONSTRAINT_TYPE,rbA,rbB)
  ;
  (this->super_btTypedConstraint)._vptr_btTypedConstraint =
       (_func_int **)&PTR__btTypedConstraint_001f1380;
  uVar1 = *(undefined8 *)((rbAFrame->m_basis).m_el[0].m_floats + 2);
  *(undefined8 *)(this->m_rbAFrame).m_basis.m_el[0].m_floats =
       *(undefined8 *)(rbAFrame->m_basis).m_el[0].m_floats;
  *(undefined8 *)((this->m_rbAFrame).m_basis.m_el[0].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((rbAFrame->m_basis).m_el[1].m_floats + 2);
  *(undefined8 *)(this->m_rbAFrame).m_basis.m_el[1].m_floats =
       *(undefined8 *)(rbAFrame->m_basis).m_el[1].m_floats;
  *(undefined8 *)((this->m_rbAFrame).m_basis.m_el[1].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((rbAFrame->m_basis).m_el[2].m_floats + 2);
  *(undefined8 *)(this->m_rbAFrame).m_basis.m_el[2].m_floats =
       *(undefined8 *)(rbAFrame->m_basis).m_el[2].m_floats;
  *(undefined8 *)((this->m_rbAFrame).m_basis.m_el[2].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((rbAFrame->m_origin).m_floats + 2);
  *(undefined8 *)(this->m_rbAFrame).m_origin.m_floats = *(undefined8 *)(rbAFrame->m_origin).m_floats
  ;
  *(undefined8 *)((this->m_rbAFrame).m_origin.m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((rbBFrame->m_basis).m_el[0].m_floats + 2);
  *(undefined8 *)(this->m_rbBFrame).m_basis.m_el[0].m_floats =
       *(undefined8 *)(rbBFrame->m_basis).m_el[0].m_floats;
  *(undefined8 *)((this->m_rbBFrame).m_basis.m_el[0].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((rbBFrame->m_basis).m_el[1].m_floats + 2);
  *(undefined8 *)(this->m_rbBFrame).m_basis.m_el[1].m_floats =
       *(undefined8 *)(rbBFrame->m_basis).m_el[1].m_floats;
  *(undefined8 *)((this->m_rbBFrame).m_basis.m_el[1].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((rbBFrame->m_basis).m_el[2].m_floats + 2);
  *(undefined8 *)(this->m_rbBFrame).m_basis.m_el[2].m_floats =
       *(undefined8 *)(rbBFrame->m_basis).m_el[2].m_floats;
  *(undefined8 *)((this->m_rbBFrame).m_basis.m_el[2].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((rbBFrame->m_origin).m_floats + 2);
  *(undefined8 *)(this->m_rbBFrame).m_origin.m_floats = *(undefined8 *)(rbBFrame->m_origin).m_floats
  ;
  *(undefined8 *)((this->m_rbBFrame).m_origin.m_floats + 2) = uVar1;
  (this->m_limit).m_center = 0.0;
  (this->m_limit).m_halfRange = -1.0;
  (this->m_limit).m_softness = 0.9;
  (this->m_limit).m_biasFactor = 0.3;
  (this->m_limit).m_relaxationFactor = 1.0;
  (this->m_limit).m_correction = 0.0;
  (this->m_limit).m_sign = 0.0;
  (this->m_limit).m_solveLimit = false;
  this->m_angularOnly = false;
  this->m_enableAngularMotor = false;
  this->m_useSolveConstraintObsolete = false;
  this->m_useOffsetForConstraintFrame = true;
  this->m_useReferenceFrameA = useReferenceFrameA;
  if (CONCAT31(in_register_00000089,useReferenceFrameA) == 0) {
    bVar2 = 1.0;
  }
  else {
    bVar2 = -1.0;
  }
  this->m_flags = 0;
  this->m_normalCFM = 0.0;
  this->m_normalERP = 0.0;
  this->m_stopCFM = 0.0;
  this->m_stopERP = 0.0;
  this->m_referenceSign = bVar2;
  return;
}

Assistant:

btHingeConstraint::btHingeConstraint(btRigidBody& rbA,btRigidBody& rbB, 
								     const btTransform& rbAFrame, const btTransform& rbBFrame, bool useReferenceFrameA)
:btTypedConstraint(HINGE_CONSTRAINT_TYPE, rbA,rbB),m_rbAFrame(rbAFrame),m_rbBFrame(rbBFrame),
#ifdef _BT_USE_CENTER_LIMIT_
m_limit(),
#endif
m_angularOnly(false),
m_enableAngularMotor(false),
m_useSolveConstraintObsolete(HINGE_USE_OBSOLETE_SOLVER),
m_useOffsetForConstraintFrame(HINGE_USE_FRAME_OFFSET),
m_useReferenceFrameA(useReferenceFrameA),
m_flags(0),
m_normalCFM(0),
m_normalERP(0),
m_stopCFM(0),
m_stopERP(0)
{
#ifndef	_BT_USE_CENTER_LIMIT_
	//start with free
	m_lowerLimit = btScalar(1.0f);
	m_upperLimit = btScalar(-1.0f);
	m_biasFactor = 0.3f;
	m_relaxationFactor = 1.0f;
	m_limitSoftness = 0.9f;
	m_solveLimit = false;
#endif
	m_referenceSign = m_useReferenceFrameA ? btScalar(-1.f) : btScalar(1.f);
}